

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor
          (StereoscopicPictureSubDescriptor *this,StereoscopicPictureSubDescriptor *rhs)

{
  byte_t *value;
  UL local_38;
  StereoscopicPictureSubDescriptor *local_18;
  StereoscopicPictureSubDescriptor *rhs_local;
  StereoscopicPictureSubDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__StereoscopicPictureSubDescriptor_0033b1b0;
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,
                           MDD_StereoscopicPictureSubDescriptor);
    UL::UL(&local_38,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_38);
    UL::~UL(&local_38);
    (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xdaf,
                "ASDCP::MXF::StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor(const StereoscopicPictureSubDescriptor &)"
               );
}

Assistant:

StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor(const StereoscopicPictureSubDescriptor& rhs) : InterchangeObject(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_StereoscopicPictureSubDescriptor);
  Copy(rhs);
}